

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:107:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:108:7)>
::getImpl(TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:107:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:108:7)>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<int> *pEVar1;
  int *in_00;
  int local_47c;
  ExceptionOr<int> local_478;
  int *local_310;
  int *depValue;
  ExceptionOr<int> local_300;
  Exception *local_198;
  Exception *depException;
  undefined1 local_180 [8];
  ExceptionOr<int> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:107:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:108:7)>
  *this_local;
  
  depResult.value.ptr = (NullableValue<int>)output;
  ExceptionOr<int>::ExceptionOr((ExceptionOr<int> *)local_180);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_180);
  local_198 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_180);
  if (local_198 == (Exception *)0x0) {
    local_310 = readMaybe<int>((Maybe<int> *)
                               ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 +
                               0x150));
    if (local_310 != (int *)0x0) {
      in_00 = mv<int>(local_310);
      local_47c = MaybeVoidCaller<int,int>::apply<kj::(anonymous_namespace)::TestCase98::run()::__1>
                            ((Type *)&this->field_0x20,in_00);
      handle(&local_478,this,&local_47c);
      pEVar1 = ExceptionOrValue::as<int>((ExceptionOrValue *)depResult.value.ptr);
      ExceptionOr<int>::operator=(pEVar1,&local_478);
      ExceptionOr<int>::~ExceptionOr(&local_478);
    }
  }
  else {
    in = mv<kj::Exception>(local_198);
    depValue._4_4_ =
         MaybeVoidCaller<kj::Exception,int>::
         apply<kj::(anonymous_namespace)::TestCase98::run()::__2>(&this->errorHandler,in);
    handle(&local_300,this,(int *)((long)&depValue + 4));
    pEVar1 = ExceptionOrValue::as<int>((ExceptionOrValue *)depResult.value.ptr);
    ExceptionOr<int>::operator=(pEVar1,&local_300);
    ExceptionOr<int>::~ExceptionOr(&local_300);
  }
  ExceptionOr<int>::~ExceptionOr((ExceptionOr<int> *)local_180);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }